

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt_wallet_tests.cpp
# Opt level: O3

void __thiscall wallet::psbt_wallet_tests::psbt_updater_test::test_method(psbt_updater_test *this)

{
  CWallet *this_00;
  undefined1 *puVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  int iVar4;
  optional<common::PSBTError> oVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *puVar8;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  Span<const_std::byte> sp_00;
  Span<const_std::byte> sp_01;
  const_string file;
  Span<const_unsigned_char> s;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar9;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  assertion_result local_678;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  DataStream local_638;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  bool complete;
  DataStream ssData;
  CTransactionRef prev_tx2;
  DataStream s_prev_tx2;
  CTransactionRef prev_tx1;
  DataStream s_prev_tx1;
  char *local_558;
  assertion_result local_550;
  assertion_result *local_538;
  string *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  element_type *local_510;
  shared_count sStack_508;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  SignatureData sigdata;
  string final_hex;
  PartiallySignedTransaction psbtx;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock5.super_unique_lock._M_device =
       &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_wallet.cs_wallet.super_recursive_mutex;
  criticalblock5.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock5.super_unique_lock);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_wallet;
  CWallet::SetWalletFlag(this_00,0x400000000);
  memcpy(&sigdata,
         _ZTAXtlN4util12hex_literals6detail3HexILm497EEEtlSt5arrayISt4byteLm248EEtlA248_S5_LS5_2ELS5_0ELS5_0ELS5_0ELS5_0ELS5_1ELS5_1ELS5_88ELS5_232ELS5_122ELS5_33ELS5_181ELS5_109ELS5_175ELS5_12ELS5_35ELS5_190ELS5_142ELS5_112ELS5_112ELS5_69ELS5_108ELS5_51ELS5_111ELS5_124ELS5_186ELS5_165ELS5_200ELS5_117ELS5_121ELS5_36ELS5_245ELS5_69ELS5_136ELS5_123ELS5_178ELS5_171ELS5_221ELS5_117ELS5_1ELS5_0ELS5_0ELS5_0ELS5_23ELS5_22ELS5_0ELS5_20ELS5_95ELS5_39ELS5_95ELS5_67ELS5_107ELS5_9ELS5_168ELS5_204ELS5_154ELS5_46ELS5_178ELS5_162ELS5_245ELS5_40ELS5_72ELS5_92ELS5_104ELS5_165ELS5_99ELS5_35ELS5_254ELS5_255ELS5_255ELS5_255ELS5_2ELS5_216ELS5_35ELS5_31ELS5_27ELS5_1ELS5_0ELS5_0ELS5_0ELS5_23ELS5_169ELS5_20ELS5_174ELS5_217ELS5_98ELS5_214ELS5_101ELS5_79ELS5_154ELS5_43ELS5_54ELS5_96ELS5_142ELS5_185ELS5_214ELS5_77ELS5_43ELS5_38ELS5_13ELS5_180ELS5_241ELS5_17ELS5_135ELS5_0ELS5_194ELS5_235ELS5_11ELS5_0ELS5_0ELS5_0ELS5_0ELS5_23ELS5_169ELS5_20ELS5_183ELS5_245ELS5_250ELS5_244ELS5_14ELS5_61ELS5_64ELS5_165ELS5_164ELS5_89ELS5_177ELS5_219ELS5_53ELS5_53ELS5_242ELS5_183ELS5_47ELS5_169ELS5_33ELS5_232ELS5_135ELS5_2ELS5_72ELS5_48ELS5_69ELS5_2ELS5_33ELS5_0ELS5_162ELS5_46ELS5_220ELS5_198ELS5_229ELS5_188ELS5_81ELS5_26ELS5_244ELS5_204ELS5_74ELS5_224ELS5_222ELS5_15ELS5_205ELS5_117ELS5_199ELS5_224ELS5_77ELS5_140ELS5_28ELS5_58ELS5_138ELS5_169ELS5_216ELS5_32ELS5_237ELS5_75ELS5_150ELS5_115ELS5_132ELS5_236ELS5_2ELS5_32ELS5_6ELS5_66ELS5_150ELS5_53ELS5_151ELS5_185ELS5_177ELS5_188ELS5_34ELS5_199ELS5_94ELS5_159ELS5_62ELS5_17ELS5_114ELS5_132ELS5_169ELS5_98ELS5_24ELS5_139ELS5_245ELS5_232ELS5_167ELS5_76ELS5_137ELS5_80ELS5_137ELS5_4ELS5_106ELS5_32ELS5_173ELS5_119ELS5_1ELS5_33ELS5_3ELS5_85ELS5_9ELS5_164ELS5_142ELS5_182ELS5_35ELS5_225ELS5_10ELS5_172ELS5_232ELS5_191ELS5_208ELS5_33ELS5_47ELS5_219ELS5_138ELS5_142ELS5_90ELS5_243ELS5_201ELS5_75ELS5_11ELS5_19ELS5_59ELS5_149ELS5_225ELS5_20ELS5_202ELS5_184ELS5_158ELS5_79ELS5_121ELS5_101EEEEE
         ,0xf8);
  sp.m_size = 0xf8;
  sp.m_data = &sigdata.complete;
  DataStream::DataStream(&s_prev_tx1,sp);
  prev_tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  prev_tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sigdata._0_8_ = &::TX_WITH_WITNESS;
  sigdata.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)&s_prev_tx1;
  Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
            ((ParamsStream<DataStream_&,_TransactionSerParams> *)&sigdata,&prev_tx1);
  puVar8 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_wallet.mapWallet;
  psbtx.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&(prev_tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->hash;
  local_550._0_8_ = local_550._0_8_ & 0xffffffffffffff00;
  sigdata._0_8_ = &local_550;
  sigdata.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)&prev_tx1;
  std::
  _Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::piecewise_construct_t_const&,std::tuple<transaction_identifier<false>const&>,std::tuple<std::shared_ptr<CTransaction_const>&,wallet::TxStateInactive&&>>
            ((_Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar8,&std::piecewise_construct);
  memcpy(&sigdata,
         _ZTAXtlN4util12hex_literals6detail3HexILm375EEEtlSt5arrayISt4byteLm187EEtlA187_S5_LS5_2ELS5_0ELS5_0ELS5_0ELS5_1ELS5_170ELS5_215ELS5_57ELS5_49ELS5_1ELS5_139ELS5_210ELS5_95ELS5_132ELS5_174ELS5_64ELS5_11ELS5_104ELS5_132ELS5_139ELS5_224ELS5_157ELS5_183ELS5_6ELS5_234ELS5_194ELS5_172ELS5_24ELS5_41ELS5_139ELS5_171ELS5_238ELS5_113ELS5_171ELS5_101ELS5_111ELS5_139ELS5_0ELS5_0ELS5_0ELS5_0ELS5_72ELS5_71ELS5_48ELS5_68ELS5_2ELS5_32ELS5_88ELS5_246ELS5_252ELS5_124ELS5_106ELS5_51ELS5_225ELS5_179ELS5_21ELS5_72ELS5_212ELS5_129ELS5_200ELS5_38ELS5_192ELS5_21ELS5_189ELS5_48ELS5_19ELS5_90ELS5_173ELS5_66ELS5_205ELS5_103ELS5_121ELS5_13ELS5_171ELS5_102ELS5_210ELS5_173ELS5_36ELS5_59ELS5_2ELS5_32ELS5_74ELS5_28ELS5_237ELS5_38ELS5_4ELS5_198ELS5_115ELS5_91ELS5_99ELS5_147ELS5_229ELS5_180ELS5_22ELS5_145ELS5_221ELS5_120ELS5_176ELS5_15ELS5_12ELS5_89ELS5_66ELS5_251ELS5_159ELS5_117ELS5_24ELS5_86ELS5_250ELS5_169ELS5_56ELS5_21ELS5_125ELS5_186ELS5_1ELS5_254ELS5_255ELS5_255ELS5_255ELS5_2ELS5_128ELS5_240ELS5_250ELS5_2ELS5_0ELS5_0ELS5_0ELS5_0ELS5_23ELS5_169ELS5_20ELS5_15ELS5_185ELS5_70ELS5_52ELS5_33ELS5_105ELS5_107ELS5_130ELS5_200ELS5_51ELS5_175ELS5_36ELS5_28ELS5_120ELS5_193ELS5_125ELS5_219ELS5_222ELS5_73ELS5_52ELS5_135ELS5_208ELS5_242ELS5_10ELS5_39ELS5_1ELS5_0ELS5_0ELS5_0ELS5_23ELS5_169ELS5_20ELS5_41ELS5_202ELS5_116ELS5_248ELS5_160ELS5_143ELS5_129ELS5_153ELS5_148ELS5_40ELS5_24ELS5_92ELS5_151ELS5_181ELS5_216ELS5_82ELS5_228ELS5_6ELS5_63ELS5_97ELS5_135ELS5_101EEEEE
         ,0xbb);
  sp_00.m_size = 0xbb;
  sp_00.m_data = &sigdata.complete;
  DataStream::DataStream(&s_prev_tx2,sp_00);
  prev_tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  prev_tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sigdata._0_8_ = &::TX_WITH_WITNESS;
  sigdata.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)&s_prev_tx2;
  Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
            ((ParamsStream<DataStream_&,_TransactionSerParams> *)&sigdata,&prev_tx2);
  psbtx.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&(prev_tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->hash;
  local_550._0_8_ = local_550._0_8_ & 0xffffffffffffff00;
  sigdata._0_8_ = &local_550;
  sigdata.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)&prev_tx2;
  std::
  _Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::piecewise_construct_t_const&,std::tuple<transaction_identifier<false>const&>,std::tuple<std::shared_ptr<CTransaction_const>&,wallet::TxStateInactive&&>>
            ((_Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar8,&std::piecewise_construct);
  puVar1 = (undefined1 *)((long)&sigdata.scriptSig.super_CScriptBase._union + 8);
  sigdata._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sigdata,
             "sh(multi(2,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/0h,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/1h))"
             ,"");
  import_descriptor(this_00,(string *)&sigdata);
  if ((undefined1 *)sigdata._0_8_ != puVar1) {
    operator_delete((void *)sigdata._0_8_,sigdata.scriptSig.super_CScriptBase._union._8_8_ + 1);
  }
  sigdata._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sigdata,
             "sh(wsh(multi(2,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/2h,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/3h)))"
             ,"");
  import_descriptor(this_00,(string *)&sigdata);
  if ((undefined1 *)sigdata._0_8_ != puVar1) {
    operator_delete((void *)sigdata._0_8_,sigdata.scriptSig.super_CScriptBase._union._8_8_ + 1);
  }
  sigdata._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sigdata,
             "wpkh(xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/*h)"
             ,"");
  import_descriptor(this_00,(string *)&sigdata);
  if ((undefined1 *)sigdata._0_8_ != puVar1) {
    operator_delete((void *)sigdata._0_8_,sigdata.scriptSig.super_CScriptBase._union._8_8_ + 1);
  }
  psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header;
  psbtx.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_engaged = false;
  psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header;
  psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psbtx.inputs.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  psbtx.inputs.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  psbtx.inputs.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psbtx.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  psbtx.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  psbtx.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psbtx.m_version.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header;
  psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  memcpy(&sigdata,
         _ZTAXtlN4util12hex_literals6detail3HexILm335EEEtlSt5arrayISt4byteLm167EEtlA167_S5_LS5_112ELS5_115ELS5_98ELS5_116ELS5_255ELS5_1ELS5_0ELS5_154ELS5_2ELS5_0ELS5_0ELS5_0ELS5_2ELS5_88ELS5_232ELS5_122ELS5_33ELS5_181ELS5_109ELS5_175ELS5_12ELS5_35ELS5_190ELS5_142ELS5_112ELS5_112ELS5_69ELS5_108ELS5_51ELS5_111ELS5_124ELS5_186ELS5_165ELS5_200ELS5_117ELS5_121ELS5_36ELS5_245ELS5_69ELS5_136ELS5_123ELS5_178ELS5_171ELS5_221ELS5_117ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_255ELS5_255ELS5_255ELS5_255ELS5_131ELS5_141ELS5_4ELS5_39ELS5_208ELS5_236ELS5_101ELS5_10ELS5_104ELS5_170ELS5_70ELS5_187ELS5_11ELS5_9ELS5_138ELS5_234ELS5_68ELS5_34ELS5_192ELS5_113ELS5_178ELS5_202ELS5_120ELS5_53ELS5_42ELS5_7ELS5_121ELS5_89ELS5_208ELS5_124ELS5_234ELS5_29ELS5_1ELS5_0ELS5_0ELS5_0ELS5_0ELS5_255ELS5_255ELS5_255ELS5_255ELS5_2ELS5_112ELS5_170ELS5_240ELS5_8ELS5_0ELS5_0ELS5_0ELS5_0ELS5_22ELS5_0ELS5_20ELS5_216ELS5_92ELS5_43ELS5_113ELS5_208ELS5_6ELS5_11ELS5_9ELS5_201ELS5_136ELS5_106ELS5_235ELS5_129ELS5_94ELS5_80ELS5_153ELS5_29ELS5_218ELS5_18ELS5_77ELS5_0ELS5_225ELS5_245ELS5_5ELS5_0ELS5_0ELS5_0ELS5_0ELS5_22ELS5_0ELS5_20ELS5_0ELS5_174ELS5_169ELS5_162ELS5_229ELS5_240ELS5_248ELS5_118ELS5_165ELS5_136ELS5_223ELS5_85ELS5_70ELS5_232ELS5_116ELS5_45ELS5_29ELS5_135ELS5_0ELS5_143EEEEE
         ,0xa7);
  sp_01.m_size = 0xa7;
  sp_01.m_data = &sigdata.complete;
  DataStream::DataStream(&ssData,sp_01);
  PartiallySignedTransaction::Unserialize<DataStream>(&psbtx,&ssData);
  complete = true;
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x43;
  file.m_begin = (iterator)&local_5f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_600,msg);
  _cVar9 = CHECK_MSG;
  oVar5 = CWallet::FillPSBT(this_00,&psbtx,&complete,1,false,true,(size_t *)0x0,true);
  local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (((ulong)oVar5.super__Optional_base<common::PSBTError,_true,_true>._M_payload.
                super__Optional_payload_base<common::PSBTError> >> 0x20 & 1) == 0);
  local_550.m_message.px = (element_type *)0x0;
  local_550.m_message.pn.pi_ = (sp_counted_base *)0x0;
  sigdata.scriptSig.super_CScriptBase._union._16_8_ = &local_638;
  local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf60f44;
  local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf60f81;
  sigdata.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)sigdata.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  sigdata._0_8_ = &PTR__lazy_ostream_01389048;
  sigdata.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_608 = "";
  pvVar6 = (iterator)0x2;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_550,(lazy_ostream *)&sigdata,2,0,WARN,_cVar9,(size_t)&local_610,0x43);
  boost::detail::shared_count::~shared_count(&local_550.m_message.pn);
  local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_638.m_read_pos = 0;
  local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PartiallySignedTransaction::Serialize<DataStream>(&psbtx,&local_638);
  s.m_data = local_638.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + local_638.m_read_pos;
  s.m_size = (long)local_638.vch.
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)s.m_data;
  HexStr_abi_cxx11_(&final_hex,s);
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x49;
  file_00.m_begin = (iterator)&local_648;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_658,
             msg_00);
  local_678.m_message.px = (element_type *)((ulong)local_678.m_message.px & 0xffffffffffffff00);
  local_678._0_8_ = &PTR__lazy_ostream_01388f08;
  local_678.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_660 = "";
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&final_hex,
                     "70736274ff01009a020000000258e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd750000000000ffffffff838d0427d0ec650a68aa46bb0b098aea4422c071b2ca78352a077959d07cea1d0100000000ffffffff0270aaf00800000000160014d85c2b71d0060b09c9886aeb815e50991dda124d00e1f5050000000016001400aea9a2e5f0f876a588df5546e8742d1d87008f00000000000100bb0200000001aad73931018bd25f84ae400b68848be09db706eac2ac18298babee71ab656f8b0000000048473044022058f6fc7c6a33e1b31548d481c826c015bd30135aad42cd67790dab66d2ad243b02204a1ced2604c6735b6393e5b41691dd78b00f0c5942fb9f751856faa938157dba01feffffff0280f0fa020000000017a9140fb9463421696b82c833af241c78c17ddbde493487d0f20a270100000017a91429ca74f8a08f81999428185c97b5d852e4063f6187650000000104475221029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f2102dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d752ae2206029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f10d90c6a4f000000800000008000000080220602dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d710d90c6a4f0000008000000080010000800001008a020000000158e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd7501000000171600145f275f436b09a8cc9a2eb2a2f528485c68a56323feffffff02d8231f1b0100000017a914aed962d6654f9a2b36608eb9d64d2b260db4f1118700c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e8876500000001012000c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e88701042200208c2353173743b595dfb4a07b72ba8e42e3797da74e87fe7d9d7497e3b2028903010547522103089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc21023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7352ae2206023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7310d90c6a4f000000800000008003000080220603089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc10d90c6a4f00000080000000800200008000220203a9a4c37f5996d3aa25dbac6b570af0650394492942460b354753ed9eeca5877110d90c6a4f000000800000008004000080002202027f6399757d2eff55a136ad02c684b1838b6556e5f1b6b34282a94b6b5005109610d90c6a4f00000080000000..." /* TRUNCATED STRING LITERAL */
                    );
  local_518 = (char *)CONCAT71(local_518._1_7_,iVar4 == 0);
  local_510 = (element_type *)0x0;
  sStack_508.pi_ = (sp_counted_base *)0x0;
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_520 = "";
  sigdata.scriptSig.super_CScriptBase._union._16_8_ = &local_530;
  sigdata.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)sigdata.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  sigdata._0_8_ = &PTR__lazy_ostream_01388fc8;
  sigdata.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_538 = (assertion_result *)&local_558;
  local_558 = 
  "70736274ff01009a020000000258e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd750000000000ffffffff838d0427d0ec650a68aa46bb0b098aea4422c071b2ca78352a077959d07cea1d0100000000ffffffff0270aaf00800000000160014d85c2b71d0060b09c9886aeb815e50991dda124d00e1f5050000000016001400aea9a2e5f0f876a588df5546e8742d1d87008f00000000000100bb0200000001aad73931018bd25f84ae400b68848be09db706eac2ac18298babee71ab656f8b0000000048473044022058f6fc7c6a33e1b31548d481c826c015bd30135aad42cd67790dab66d2ad243b02204a1ced2604c6735b6393e5b41691dd78b00f0c5942fb9f751856faa938157dba01feffffff0280f0fa020000000017a9140fb9463421696b82c833af241c78c17ddbde493487d0f20a270100000017a91429ca74f8a08f81999428185c97b5d852e4063f6187650000000104475221029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f2102dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d752ae2206029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f10d90c6a4f000000800000008000000080220602dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d710d90c6a4f0000008000000080010000800001008a020000000158e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd7501000000171600145f275f436b09a8cc9a2eb2a2f528485c68a56323feffffff02d8231f1b0100000017a914aed962d6654f9a2b36608eb9d64d2b260db4f1118700c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e8876500000001012000c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e88701042200208c2353173743b595dfb4a07b72ba8e42e3797da74e87fe7d9d7497e3b2028903010547522103089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc21023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7352ae2206023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7310d90c6a4f000000800000008003000080220603089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc10d90c6a4f00000080000000800200008000220203a9a4c37f5996d3aa25dbac6b570af0650394492942460b354753ed9eeca5877110d90c6a4f000000800000008004000080002202027f6399757d2eff55a136ad02c684b1838b6556e5f1b6b34282a94b6b5005109610d90c6a4f00000080000000..." /* TRUNCATED STRING LITERAL */
  ;
  local_550.m_message.px = (element_type *)((ulong)local_550.m_message.px & 0xffffffffffffff00);
  local_550._0_8_ = &PTR__lazy_ostream_0138ff90;
  local_550.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_530 = &final_hex;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_518,(lazy_ostream *)&local_678,1,2,REQUIRE,0xf60f82,
             (size_t)&local_528,0x49,&sigdata,
             "\"70736274ff01009a020000000258e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd750000000000ffffffff838d0427d0ec650a68aa46bb0b098aea4422c071b2ca78352a077959d07cea1d0100000000ffffffff0270aaf00800000000160014d85c2b71d0060b09c9886aeb815e50991dda124d00e1f5050000000016001400aea9a2e5f0f876a588df5546e8742d1d87008f00000000000100bb0200000001aad73931018bd25f84ae400b68848be09db706eac2ac18298babee71ab656f8b0000000048473044022058f6fc7c6a33e1b31548d481c826c015bd30135aad42cd67790dab66d2ad243b02204a1ced2604c6735b6393e5b41691dd78b00f0c5942fb9f751856faa938157dba01feffffff0280f0fa020000000017a9140fb9463421696b82c833af241c78c17ddbde493487d0f20a270100000017a91429ca74f8a08f81999428185c97b5d852e4063f6187650000000104475221029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f2102dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d752ae2206029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f10d90c6a4f000000800000008000000080220602dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d710d90c6a4f0000008000000080010000800001008a020000000158e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd7501000000171600145f275f436b09a8cc9a2eb2a2f528485c68a56323feffffff02d8231f1b0100000017a914aed962d6654f9a2b36608eb9d64d2b260db4f1118700c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e8876500000001012000c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e88701042200208c2353173743b595dfb4a07b72ba8e42e3797da74e87fe7d9d7497e3b2028903010547522103089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc21023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7352ae2206023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7310d90c6a4f000000800000008003000080220603089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc10d90c6a4f00000080000000800200008000220203a9a4c37f5996d3aa25dbac6b570af0650394492942460b354753ed9eeca5877110d90c6a4f000000800000008004000080002202027f6399757d2eff55a136ad02c684b1838b6556e5f1b6b34282a94b6b5005109610d90c6a4f0000008000000..." /* TRUNCATED STRING LITERAL */
             ,&local_550);
  boost::detail::shared_count::~shared_count(&sStack_508);
  ((psbtx.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
    super__Optional_payload<CMutableTransaction,_true,_false,_false>.
    super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
    super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start)->
  prevout).n = 2;
  sigdata._0_8_ = sigdata._0_8_ & 0xffffffffffff0000;
  p_Var2 = &sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&sigdata.scriptSig,0,0xb8);
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sigdata.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sigdata.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  sigdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  sigdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sigdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sigdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sigdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000050;
  file_01.m_begin = (iterator)&local_688;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_698,
             msg_01);
  _cVar9 = CHECK_MSG;
  oVar5 = CWallet::FillPSBT(this_00,&psbtx,&complete,1,true,true,(size_t *)0x0,true);
  local_678.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       oVar5.super__Optional_base<common::PSBTError,_true,_true>._M_payload.
       super__Optional_payload_base<common::PSBTError>._M_engaged;
  local_678.m_message.px = (element_type *)0x0;
  local_678.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_518 = "m_wallet.FillPSBT(psbtx, complete, SIGHASH_ALL, true, true)";
  local_510 = (element_type *)0xf61fe3;
  local_550.m_message.px = (element_type *)((ulong)local_550.m_message.px & 0xffffffffffffff00);
  local_550._0_8_ = &PTR__lazy_ostream_01389048;
  local_550.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_6a0 = "";
  local_538 = (assertion_result *)&local_518;
  boost::test_tools::tt_detail::report_assertion
            (&local_678,(lazy_ostream *)&local_550,1,0,WARN,_cVar9,(size_t)&local_6a8,0x50);
  boost::detail::shared_count::~shared_count(&local_678.m_message.pn);
  SignatureData::~SignatureData(&sigdata);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)final_hex._M_dataplus._M_p != &final_hex.field_2) {
    operator_delete(final_hex._M_dataplus._M_p,final_hex.field_2._M_allocated_capacity + 1);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_638);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ssData);
  std::
  _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
  ::~_Rb_tree(&psbtx.m_proprietary._M_t);
  std::
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree(&psbtx.unknown._M_t);
  std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::~vector(&psbtx.outputs);
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::~vector(&psbtx.inputs);
  std::
  _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  ::~_Rb_tree(&psbtx.m_xpubs._M_t);
  std::_Optional_payload_base<CMutableTransaction>::_M_reset
            ((_Optional_payload_base<CMutableTransaction> *)&psbtx);
  if (prev_tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (prev_tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&s_prev_tx2);
  if (prev_tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (prev_tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&s_prev_tx1);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock5.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(psbt_updater_test)
{
    LOCK(m_wallet.cs_wallet);
    m_wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);

    // Create prevtxs and add to wallet
    DataStream s_prev_tx1{
        "0200000000010158e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd7501000000171600145f275f436b09a8cc9a2eb2a2f528485c68a56323feffffff02d8231f1b0100000017a914aed962d6654f9a2b36608eb9d64d2b260db4f1118700c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e88702483045022100a22edcc6e5bc511af4cc4ae0de0fcd75c7e04d8c1c3a8aa9d820ed4b967384ec02200642963597b9b1bc22c75e9f3e117284a962188bf5e8a74c895089046a20ad770121035509a48eb623e10aace8bfd0212fdb8a8e5af3c94b0b133b95e114cab89e4f7965000000"_hex,
    };
    CTransactionRef prev_tx1;
    s_prev_tx1 >> TX_WITH_WITNESS(prev_tx1);
    m_wallet.mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(prev_tx1->GetHash()), std::forward_as_tuple(prev_tx1, TxStateInactive{}));

    DataStream s_prev_tx2{
        "0200000001aad73931018bd25f84ae400b68848be09db706eac2ac18298babee71ab656f8b0000000048473044022058f6fc7c6a33e1b31548d481c826c015bd30135aad42cd67790dab66d2ad243b02204a1ced2604c6735b6393e5b41691dd78b00f0c5942fb9f751856faa938157dba01feffffff0280f0fa020000000017a9140fb9463421696b82c833af241c78c17ddbde493487d0f20a270100000017a91429ca74f8a08f81999428185c97b5d852e4063f618765000000"_hex,
    };
    CTransactionRef prev_tx2;
    s_prev_tx2 >> TX_WITH_WITNESS(prev_tx2);
    m_wallet.mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(prev_tx2->GetHash()), std::forward_as_tuple(prev_tx2, TxStateInactive{}));

    // Import descriptors for keys and scripts
    import_descriptor(m_wallet, "sh(multi(2,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/0h,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/1h))");
    import_descriptor(m_wallet, "sh(wsh(multi(2,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/2h,xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/3h)))");
    import_descriptor(m_wallet, "wpkh(xprv9s21ZrQH143K2LE7W4Xf3jATf9jECxSb7wj91ZnmY4qEJrS66Qru9RFqq8xbkgT32ya6HqYJweFdJUEDf5Q6JFV7jMiUws7kQfe6Tv4RbfN/0h/0h/*h)");

    // Call FillPSBT
    PartiallySignedTransaction psbtx;
    DataStream ssData{
        "70736274ff01009a020000000258e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd750000000000ffffffff838d0427d0ec650a68aa46bb0b098aea4422c071b2ca78352a077959d07cea1d0100000000ffffffff0270aaf00800000000160014d85c2b71d0060b09c9886aeb815e50991dda124d00e1f5050000000016001400aea9a2e5f0f876a588df5546e8742d1d87008f000000000000000000"_hex,
    };
    ssData >> psbtx;

    // Fill transaction with our data
    bool complete = true;
    BOOST_REQUIRE(!m_wallet.FillPSBT(psbtx, complete, SIGHASH_ALL, false, true));

    // Get the final tx
    DataStream ssTx{};
    ssTx << psbtx;
    std::string final_hex = HexStr(ssTx);
    BOOST_CHECK_EQUAL(final_hex, "70736274ff01009a020000000258e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd750000000000ffffffff838d0427d0ec650a68aa46bb0b098aea4422c071b2ca78352a077959d07cea1d0100000000ffffffff0270aaf00800000000160014d85c2b71d0060b09c9886aeb815e50991dda124d00e1f5050000000016001400aea9a2e5f0f876a588df5546e8742d1d87008f00000000000100bb0200000001aad73931018bd25f84ae400b68848be09db706eac2ac18298babee71ab656f8b0000000048473044022058f6fc7c6a33e1b31548d481c826c015bd30135aad42cd67790dab66d2ad243b02204a1ced2604c6735b6393e5b41691dd78b00f0c5942fb9f751856faa938157dba01feffffff0280f0fa020000000017a9140fb9463421696b82c833af241c78c17ddbde493487d0f20a270100000017a91429ca74f8a08f81999428185c97b5d852e4063f6187650000000104475221029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f2102dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d752ae2206029583bf39ae0a609747ad199addd634fa6108559d6c5cd39b4c2183f1ab96e07f10d90c6a4f000000800000008000000080220602dab61ff49a14db6a7d02b0cd1fbb78fc4b18312b5b4e54dae4dba2fbfef536d710d90c6a4f0000008000000080010000800001008a020000000158e87a21b56daf0c23be8e7070456c336f7cbaa5c8757924f545887bb2abdd7501000000171600145f275f436b09a8cc9a2eb2a2f528485c68a56323feffffff02d8231f1b0100000017a914aed962d6654f9a2b36608eb9d64d2b260db4f1118700c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e8876500000001012000c2eb0b0000000017a914b7f5faf40e3d40a5a459b1db3535f2b72fa921e88701042200208c2353173743b595dfb4a07b72ba8e42e3797da74e87fe7d9d7497e3b2028903010547522103089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc21023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7352ae2206023add904f3d6dcf59ddb906b0dee23529b7ffb9ed50e5e86151926860221f0e7310d90c6a4f000000800000008003000080220603089dc10c7ac6db54f91329af617333db388cead0c231f723379d1b99030b02dc10d90c6a4f00000080000000800200008000220203a9a4c37f5996d3aa25dbac6b570af0650394492942460b354753ed9eeca5877110d90c6a4f000000800000008004000080002202027f6399757d2eff55a136ad02c684b1838b6556e5f1b6b34282a94b6b5005109610d90c6a4f00000080000000800500008000");

    // Mutate the transaction so that one of the inputs is invalid
    psbtx.tx->vin[0].prevout.n = 2;

    // Try to sign the mutated input
    SignatureData sigdata;
    BOOST_CHECK(m_wallet.FillPSBT(psbtx, complete, SIGHASH_ALL, true, true));
}